

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_mul_2d(mp_int *a,int b,mp_int *c)

{
  mp_digit *pmVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  mp_digit mVar6;
  long lVar7;
  ulong uVar8;
  
  if ((a == c) || (iVar3 = mp_copy(a,c), iVar3 == 0)) {
    iVar3 = c->used + b / 0x3c;
    if (((iVar3 < c->alloc) || (iVar3 = mp_grow(c,iVar3 + 1), iVar3 == 0)) &&
       ((b < 0x3c || (iVar3 = mp_lshd(c,b / 0x3c), iVar3 == 0)))) {
      if (b % 0x3c != 0) {
        bVar4 = (byte)(b % 0x3c);
        pmVar1 = c->dp;
        iVar3 = c->used;
        if ((long)iVar3 < 1) {
          mVar6 = 0;
        }
        else {
          lVar7 = 0;
          uVar8 = 0;
          do {
            mVar6 = pmVar1[lVar7] >> (0x3c - bVar4 & 0x3f) & ~(-1L << (bVar4 & 0x3f));
            pmVar1[lVar7] = (pmVar1[lVar7] << (bVar4 & 0x3f) | uVar8) & 0xfffffffffffffff;
            lVar7 = lVar7 + 1;
            uVar8 = mVar6;
          } while (iVar3 != (int)lVar7);
        }
        if (mVar6 != 0) {
          c->used = iVar3 + 1;
          pmVar1[iVar3] = mVar6;
        }
      }
      uVar5 = c->used;
      if (0 < (int)uVar5) {
        do {
          if (c->dp[(ulong)uVar5 - 1] != 0) goto LAB_00104603;
          c->used = uVar5 - 1;
          bVar2 = 1 < (int)uVar5;
          uVar5 = uVar5 - 1;
        } while (bVar2);
        uVar5 = 0;
      }
LAB_00104603:
      iVar3 = 0;
      if (uVar5 == 0) {
        c->sign = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mp_mul_2d (mp_int * a, int b, mp_int * c)
{
  mp_digit d;
  int      res;

  /* copy */
  if (a != c) {
     if ((res = mp_copy (a, c)) != MP_OKAY) {
       return res;
     }
  }

  if (c->alloc < (int)(c->used + b/DIGIT_BIT + 1)) {
     if ((res = mp_grow (c, c->used + b / DIGIT_BIT + 1)) != MP_OKAY) {
       return res;
     }
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    if ((res = mp_lshd (c, b / DIGIT_BIT)) != MP_OKAY) {
      return res;
    }
  }

  /* shift any bit count < DIGIT_BIT */
  d = (mp_digit) (b % DIGIT_BIT);
  if (d != 0) {
    register mp_digit *tmpc, shift, mask, r, rr;
    register int x;

    /* bitmask for carries */
    mask = (((mp_digit)1) << d) - 1;

    /* shift for msbs */
    shift = DIGIT_BIT - d;

    /* alias */
    tmpc = c->dp;

    /* carry */
    r    = 0;
    for (x = 0; x < c->used; x++) {
      /* get the higher bits of the current word */
      rr = (*tmpc >> shift) & mask;

      /* shift the current word and OR in the carry */
      *tmpc = ((*tmpc << d) | r) & MP_MASK;
      ++tmpc;

      /* set the carry to the carry bits of the current word */
      r = rr;
    }
    
    /* set final carry */
    if (r != 0) {
       c->dp[(c->used)++] = r;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}